

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O0

int Parser_skipMisc(Parser *xmlParser)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  int iVar4;
  size_t sVar5;
  int local_14;
  int done;
  int rc;
  Parser *xmlParser_local;
  
  local_14 = 0;
  bVar2 = false;
  do {
    pcVar3 = BEGIN_COMMENT;
    if (bVar2 || local_14 != 0) {
      return local_14;
    }
    pcVar1 = xmlParser->curPtr;
    sVar5 = strlen(BEGIN_COMMENT);
    iVar4 = strncasecmp(pcVar1,pcVar3,sVar5);
    pcVar3 = XMLDECL;
    if (iVar4 == 0) {
      local_14 = Parser_skipComment(&xmlParser->curPtr);
    }
    else {
      pcVar1 = xmlParser->curPtr;
      sVar5 = strlen(XMLDECL);
      iVar4 = strncasecmp(pcVar1,pcVar3,sVar5);
      pcVar3 = XMLDECL2;
      if (iVar4 != 0) {
        pcVar1 = xmlParser->curPtr;
        sVar5 = strlen(XMLDECL2);
        iVar4 = strncasecmp(pcVar1,pcVar3,sVar5);
        pcVar3 = BEGIN_PI;
        if (iVar4 != 0) {
          pcVar1 = xmlParser->curPtr;
          sVar5 = strlen(BEGIN_PI);
          iVar4 = strncasecmp(pcVar1,pcVar3,sVar5);
          if (iVar4 == 0) {
            local_14 = Parser_skipString(&xmlParser->curPtr,END_PI);
          }
          else {
            bVar2 = true;
          }
          goto LAB_0013b07d;
        }
      }
      local_14 = 0xc;
    }
LAB_0013b07d:
    Parser_skipWhiteSpaces(xmlParser);
  } while( true );
}

Assistant:

static int Parser_skipMisc(
	/*! [in] The XML parser. */
	Parser *xmlParser)
{
	int rc = IXML_SUCCESS;
	int done = 0;

	while ((done == 0) && (rc == IXML_SUCCESS)) {
		if (strncasecmp(xmlParser->curPtr,
			    BEGIN_COMMENT,
			    strlen(BEGIN_COMMENT)) == 0) {
			/* <!-- */
			rc = Parser_skipComment(&(xmlParser->curPtr));

		} else if (strncasecmp(xmlParser->curPtr,
				   XMLDECL,
				   strlen(XMLDECL)) == 0 ||
			   strncasecmp(xmlParser->curPtr,
				   XMLDECL2,
				   strlen(XMLDECL2)) == 0) {
			/* <?xml or <?xml? */
			rc = IXML_SYNTAX_ERR;
		} else if (strncasecmp(xmlParser->curPtr,
				   BEGIN_PI,
				   strlen(BEGIN_PI)) == 0) {
			/* <? */
			rc = Parser_skipString(&xmlParser->curPtr, END_PI);
		} else {
			done = 1;
		}
		Parser_skipWhiteSpaces(xmlParser);
	}

	return rc;
}